

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFx.c
# Opt level: O2

void Fx_PrintDiv(Fx_Man_t *p,int iDiv)

{
  char cVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  abctime aVar5;
  abctime time;
  char *pStr;
  int iVar6;
  float fVar7;
  
  printf("%4d : ",(ulong)(uint)p->nDivs);
  printf("Div %7d : ",iDiv);
  fVar7 = Vec_FltEntry(p->vWeights,iDiv);
  printf("Weight %12.5f  ",(double)fVar7);
  pVVar4 = Hsh_VecReadEntry(p->pHash,iDiv);
  for (iVar6 = 0; iVar6 < pVVar4->nSize; iVar6 = iVar6 + 1) {
    iVar2 = Vec_IntEntry(pVVar4,iVar6);
    iVar3 = Abc_LitIsCompl(iVar2);
    if (iVar3 == 0) {
      iVar2 = Abc_LitIsCompl(iVar2);
      iVar2 = Abc_Var2Lit(iVar6,iVar2);
      cVar1 = Fx_PrintDivLit(iVar2);
      putchar((int)cVar1);
    }
  }
  printf(" + ");
  for (iVar6 = 0; iVar6 < pVVar4->nSize; iVar6 = iVar6 + 1) {
    iVar2 = Vec_IntEntry(pVVar4,iVar6);
    iVar3 = Abc_LitIsCompl(iVar2);
    if (iVar3 != 0) {
      iVar2 = Abc_LitIsCompl(iVar2);
      iVar2 = Abc_Var2Lit(iVar6,iVar2);
      cVar1 = Fx_PrintDivLit(iVar2);
      putchar((int)cVar1);
    }
  }
  pVVar4 = Hsh_VecReadEntry(p->pHash,iDiv);
  for (iVar6 = pVVar4->nSize + 3; iVar6 < 0x10; iVar6 = iVar6 + 1) {
    putchar(0x20);
  }
  printf("Lits =%7d  ",(ulong)(uint)p->nLits);
  pStr = (char *)(ulong)(uint)p->pHash->vMap->nSize;
  printf("Divs =%8d  ");
  aVar5 = Abc_Clock();
  Abc_PrintTime((int)aVar5 - (int)p->timeStart,pStr,time);
  return;
}

Assistant:

static inline void Fx_PrintDiv( Fx_Man_t * p, int iDiv )
{
    int i;
    printf( "%4d : ", p->nDivs );
    printf( "Div %7d : ", iDiv );
    printf( "Weight %12.5f  ", Vec_FltEntry(p->vWeights, iDiv) );
//    printf( "Compl %4d  ", p->nCompls );
    Fx_PrintDivOne( Hsh_VecReadEntry(p->pHash, iDiv) );
    for ( i = Vec_IntSize(Hsh_VecReadEntry(p->pHash, iDiv)) + 3; i < 16; i++ )
        printf( " " );
    printf( "Lits =%7d  ", p->nLits );
    printf( "Divs =%8d  ", Hsh_VecSize(p->pHash) );
    Abc_PrintTime( 1, "Time", Abc_Clock() - p->timeStart );
}